

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GLSL420Pack::InitializerListTest::getVectorInitializer_abi_cxx11_
          (string *__return_storage_ptr__,InitializerListTest *this,GLuint column,GLuint size)

{
  InitializerListTest *this_00;
  string sStack_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_00 = (InitializerListTest *)0x181050b;
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  getVectorValues_abi_cxx11_(&sStack_38,this_00,column,size);
  std::__cxx11::string::append((string *)__return_storage_ptr__);
  std::__cxx11::string::~string((string *)&sStack_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string InitializerListTest::getVectorInitializer(GLuint column, GLuint size)
{
	std::string result;

	result.append("{");
	result.append(getVectorValues(column, size));
	result.append("}");

	return result;
}